

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O2

string * __thiscall inja::Token::describe_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  Kind KVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  KVar1 = this->kind;
  if (KVar1 == Eof) {
    __s = "<eof>";
    __a = &local_b;
  }
  else if (KVar1 == LineStatementClose) {
    __s = "<eol>";
    __a = &local_a;
  }
  else {
    if (KVar1 != Text) {
      ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,&this->text,&local_c);
      return __return_storage_ptr__;
    }
    __s = "<text>";
    __a = &local_9;
  }
  ::std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string describe() const {
    switch (kind) {
    case Kind::Text:
      return "<text>";
    case Kind::LineStatementClose:
      return "<eol>";
    case Kind::Eof:
      return "<eof>";
    default:
      return static_cast<std::string>(text);
    }
  }